

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialogs.cpp
# Opt level: O1

intptr_t DlgProc(uintptr_t pDlg,char *DlgItemName,intptr_t Msg,intptr_t wParam,intptr_t lParam)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Alloc_hider _Var3;
  size_type sVar4;
  Type TVar5;
  int iVar6;
  Json *pJVar7;
  string *psVar8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
  *__x;
  mapped_type *pmVar9;
  intptr_t iVar10;
  char *value;
  bool bVar11;
  object json_obj;
  ofstream ofs;
  string local_298;
  string local_278;
  undefined1 local_258 [48];
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [14];
  ios_base local_130 [264];
  
  if (Msg == 0x1001) {
    iVar6 = strcmp(DlgItemName,"btnOK");
    if (iVar6 == 0) {
      __x = &json11::Json::object_items_abi_cxx11_(&gJson)->_M_t;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                  *)local_258,__x);
      std::ofstream::ofstream(local_228);
      iVar10 = (*gExtension->SendDlgMsg)(pDlg,"getTokenRadio",0x13,0,0);
      value = "manual";
      if ((int)iVar10 == 0) {
        value = "oauth";
      }
      json11::Json::Json((Json *)&local_278,value);
      paVar1 = &local_298.field_2;
      local_298._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"get_token_method","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                             *)local_258,&local_298);
      sVar4 = local_278._M_string_length;
      _Var3._M_p = local_278._M_dataplus._M_p;
      local_278._M_dataplus._M_p = (pointer)0x0;
      local_278._M_string_length = 0;
      p_Var2 = (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var3._M_p;
      (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar1) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
      }
      iVar10 = (*gExtension->SendDlgMsg)(pDlg,"saveMethodRadio",0x13,0,0);
      if ((int)iVar10 == 1) {
        json11::Json::Json((Json *)&local_278,"config");
        local_298._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"save_type","");
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                               *)local_258,&local_298);
      }
      else if ((int)iVar10 == 2) {
        json11::Json::Json((Json *)&local_278,"password_manager");
        local_298._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"save_type","");
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                               *)local_258,&local_298);
        sVar4 = local_278._M_string_length;
        _Var3._M_p = local_278._M_dataplus._M_p;
        local_278._M_dataplus._M_p = (pointer)0x0;
        local_278._M_string_length = 0;
        p_Var2 = (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)_Var3._M_p;
        (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != paVar1) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
        }
        json11::Json::Json((Json *)&local_278,"");
        local_298._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"oauth_token","");
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                               *)local_258,&local_298);
      }
      else {
        json11::Json::Json((Json *)&local_278,"dont_save");
        local_298._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"save_type","");
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                               *)local_258,&local_298);
        sVar4 = local_278._M_string_length;
        _Var3._M_p = local_278._M_dataplus._M_p;
        local_278._M_dataplus._M_p = (pointer)0x0;
        local_278._M_string_length = 0;
        p_Var2 = (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)_Var3._M_p;
        (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != paVar1) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
        }
        json11::Json::Json((Json *)&local_278,"");
        local_298._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"oauth_token","");
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                               *)local_258,&local_298);
      }
      sVar4 = local_278._M_string_length;
      _Var3._M_p = local_278._M_dataplus._M_p;
      local_278._M_dataplus._M_p = (pointer)0x0;
      local_278._M_string_length = 0;
      p_Var2 = (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var3._M_p;
      (pmVar9->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar1) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
      }
      std::ofstream::open((string *)local_228,0x181f78);
      json11::Json::Json((Json *)&local_278,(object *)local_258);
      json11::Json::dump_abi_cxx11_(&local_298,(Json *)&local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,local_298._M_dataplus._M_p,local_298._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar1) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
      }
      std::ofstream::close();
      (*gExtension->SendDlgMsg)(pDlg,DlgItemName,1,1,0);
      local_228._0_8_ = _VTT;
      *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18)) = ___throw_range_error;
      std::filebuf::~filebuf((filebuf *)(local_228 + 8));
      std::ios_base::~ios_base(local_130);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                   *)local_258);
      return 0;
    }
    iVar6 = strcmp(DlgItemName,"btnCancel");
    if (iVar6 != 0) {
      return 0;
    }
    iVar10 = 1;
  }
  else {
    if (Msg != 0x1005) {
      return 0;
    }
    local_228._0_8_ = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"get_token_method","");
    pJVar7 = json11::Json::operator[](&gJson,(string *)local_228);
    TVar5 = json11::Json::type(pJVar7);
    if (TVar5 == STRING) {
      local_258._0_8_ = local_258 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"get_token_method","");
      pJVar7 = json11::Json::operator[](&gJson,(string *)local_258);
      psVar8 = json11::Json::string_value_abi_cxx11_(pJVar7);
      iVar6 = std::__cxx11::string::compare((char *)psVar8);
      bVar11 = iVar6 == 0;
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
      }
    }
    else {
      bVar11 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != local_218) {
      operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
    }
    (*gExtension->SendDlgMsg)(pDlg,"getTokenRadio",0x14,SUB18(bVar11,0),0);
    local_228._0_8_ = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"save_type","");
    pJVar7 = json11::Json::operator[](&gJson,(string *)local_228);
    TVar5 = json11::Json::type(pJVar7);
    if (TVar5 == STRING) {
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"save_type","");
      pJVar7 = json11::Json::operator[](&gJson,&local_298);
      psVar8 = json11::Json::string_value_abi_cxx11_(pJVar7);
      iVar6 = std::__cxx11::string::compare((char *)psVar8);
      bVar11 = iVar6 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar11 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != local_218) {
      operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
    }
    if (!bVar11) {
      local_228._0_8_ = local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"save_type","");
      pJVar7 = json11::Json::operator[](&gJson,(string *)local_228);
      TVar5 = json11::Json::type(pJVar7);
      if (TVar5 == STRING) {
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"save_type","");
        pJVar7 = json11::Json::operator[](&gJson,&local_278);
        psVar8 = json11::Json::string_value_abi_cxx11_(pJVar7);
        iVar6 = std::__cxx11::string::compare((char *)psVar8);
        bVar11 = iVar6 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar11 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._0_8_ != local_218) {
        operator_delete((void *)local_228._0_8_,local_218[0]._M_allocated_capacity + 1);
      }
      if (bVar11) {
        iVar10 = 2;
      }
      else {
        iVar10 = 0;
      }
      (*gExtension->SendDlgMsg)(pDlg,"saveMethodRadio",0x14,iVar10,0);
      return 0;
    }
    DlgItemName = "saveMethodRadio";
    iVar10 = 0x14;
  }
  (*gExtension->SendDlgMsg)(pDlg,DlgItemName,iVar10,1,0);
  return 0;
}

Assistant:

intptr_t DCPCALL DlgProc(uintptr_t pDlg, char *DlgItemName, intptr_t Msg, intptr_t wParam, intptr_t lParam)
{
    switch (Msg){
        case DN_INITDIALOG:
            if(gJson["get_token_method"].is_string() && gJson["get_token_method"].string_value() == "manual")
                gExtension->SendDlgMsg(pDlg, "getTokenRadio", DM_LISTSETITEMINDEX, 1, 0);
            else
                gExtension->SendDlgMsg(pDlg, "getTokenRadio", DM_LISTSETITEMINDEX, 0, 0);

            if(gJson["save_type"].is_string() && gJson["save_type"].string_value() == "config")
                gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTSETITEMINDEX, 1, 0);
            else if(gJson["save_type"].is_string() && gJson["save_type"].string_value() == "password_manager")
                gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTSETITEMINDEX, 2, 0);
            else
                gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTSETITEMINDEX, 0, 0); // dont_save by default

            break;

        case DN_CHANGE:
            break;

        case DN_CLICK:
            if(strcmp(DlgItemName, "btnOK")==0){
                json11::Json::object json_obj = gJson.object_items();
                std::ofstream ofs;

                int res = gExtension->SendDlgMsg(pDlg, "getTokenRadio", DM_LISTGETITEMINDEX, 0, 0);
                json_obj["get_token_method"] = (res==0)? "oauth" : "manual";

                res = gExtension->SendDlgMsg(pDlg, "saveMethodRadio", DM_LISTGETITEMINDEX, 0, 0);
                switch(res){
                    case 1:
                        json_obj["save_type"] = "config";
                        break;
                    case 2:
                        json_obj["save_type"] = "password_manager";
                        json_obj["oauth_token"] = "";
                        break;
                    default:
                        json_obj["save_type"] = "dont_save";
                        json_obj["oauth_token"] = "";
                }

                ofs.open(gConfig_path, std::ofstream::out | std::ios::trunc);
                ofs << json11::Json(json_obj).dump();
                ofs.close();

                gExtension->SendDlgMsg(pDlg, DlgItemName, DM_CLOSE, 1, 0);
            } else if(strcmp(DlgItemName, "btnCancel")==0){
                gExtension->SendDlgMsg(pDlg, DlgItemName, DM_CLOSE, 1, 0);
            }

            break;
    }
    return 0;
}